

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

uint64_t __thiscall kaitai::kstream::read_bits_int_le(kstream *this,int n)

{
  ulong uVar1;
  runtime_error *this_00;
  long lVar2;
  ulong uVar3;
  byte *pbVar4;
  int iVar5;
  uint8_t buf [8];
  
  iVar5 = n - this->m_bits_left;
  if (iVar5 == 0 || n < this->m_bits_left) {
    uVar3 = this->m_bits;
    this->m_bits = uVar3 >> ((byte)n & 0x3f);
  }
  else {
    if (0x3f < iVar5 - 1U) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"read_bits_int_le: more than 8 bytes requested");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pbVar4 = buf;
    std::istream::read((char *)this->m_io,(long)pbVar4);
    uVar3 = 0;
    for (lVar2 = 0; (ulong)(iVar5 - 1U & 0xfffffff8) + 8 != lVar2; lVar2 = lVar2 + 8) {
      uVar3 = uVar3 | (ulong)*pbVar4 << ((byte)lVar2 & 0x3f);
      pbVar4 = pbVar4 + 1;
    }
    uVar1 = 0;
    if (iVar5 < 0x40) {
      uVar1 = uVar3 >> ((byte)iVar5 & 0x3f);
    }
    uVar3 = uVar3 << ((byte)this->m_bits_left & 0x3f) | this->m_bits;
    this->m_bits = uVar1;
  }
  this->m_bits_left = -iVar5 & 7;
  uVar1 = ~(-1L << ((byte)n & 0x3f));
  if (0x3f < n) {
    uVar1 = 0xffffffffffffffff;
  }
  return uVar1 & uVar3;
}

Assistant:

uint64_t kaitai::kstream::read_bits_int_le(int n) {
    uint64_t res = 0;
    int bits_needed = n - m_bits_left;

    if (bits_needed > 0) {
        // 1 bit  => 1 byte
        // 8 bits => 1 byte
        // 9 bits => 2 bytes
        int bytes_needed = ((bits_needed - 1) / 8) + 1; // `ceil(bits_needed / 8)`
        if (bytes_needed > 8)
            throw std::runtime_error("read_bits_int_le: more than 8 bytes requested");
        uint8_t buf[8];
        m_io->read(reinterpret_cast<char *>(buf), bytes_needed);
        for (int i = 0; i < bytes_needed; i++) {
            res |= static_cast<uint64_t>(buf[i]) << (i * 8);
        }

        // NB: for bit shift operators in C++, "if the value of the right operand is
        // negative or is greater or equal to the number of bits in the promoted left
        // operand, the behavior is undefined." (see
        // https://en.cppreference.com/w/cpp/language/operator_arithmetic#Bitwise_shift_operators)
        // So we define our desired behavior here.
        uint64_t new_bits = bits_needed < 64 ? res >> bits_needed : 0;
        res = res << m_bits_left | m_bits;
        m_bits = new_bits;
    } else {
        res = m_bits;
        m_bits >>= n;
    }

    m_bits_left = -bits_needed & 7; // `-bits_needed mod 8`

    if (n < 64) {
        uint64_t mask = (UINT64_C(1) << n) - 1;
        res &= mask;
    }
    // if `n == 64`, do nothing
    return res;
}